

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

Bigint * pow5mult(Bigint *b,int k)

{
  Bigint *b_00;
  Bigint *pBVar1;
  uint uVar2;
  Bigint *a;
  
  if (((k & 3U) != 0) && (b = multadd(b,pow5mult::p05[(k & 3U) - 1],0), b == (Bigint *)0x0)) {
    return (Bigint *)0x0;
  }
  if (3 < (uint)k) {
    b_00 = (Bigint *)
           __ckd_malloc__(0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/dtoa.c"
                          ,0x1a9);
    if (b_00 != (Bigint *)0x0) {
      uVar2 = (uint)k >> 2;
      b_00->x[0] = 0x271;
      b_00->k = 1;
      b_00->maxwds = 2;
      b_00->sign = 0;
      b_00->wds = 1;
      a = b;
      do {
        b = a;
        if ((uVar2 & 1) != 0) {
          b = mult(a,b_00);
          if (a != (Bigint *)0x0) {
            ckd_free(a);
          }
          if (b == (Bigint *)0x0) {
            b = (Bigint *)0x0;
            goto LAB_0010e026;
          }
        }
        if (uVar2 < 2) goto LAB_0010e026;
        uVar2 = uVar2 >> 1;
        pBVar1 = mult(b_00,b_00);
        ckd_free(b_00);
        b_00 = pBVar1;
        a = b;
      } while (pBVar1 != (Bigint *)0x0);
    }
    b_00 = b;
    b = (Bigint *)0x0;
    if (b_00 != (Bigint *)0x0) {
LAB_0010e026:
      ckd_free(b_00);
    }
  }
  return b;
}

Assistant:

static Bigint *
pow5mult(Bigint *b, int k)
{
    Bigint *b1, *p5, *p51;
    int i;
    static int p05[3] = { 5, 25, 125 };

    if ((i = k & 3)) {
        b = multadd(b, p05[i-1], 0);
        if (b == NULL)
            return NULL;
    }

    if (!(k >>= 2))
        return b;
    p5 = i2b(625);
    if (p5 == NULL) {
        Bfree(b);
        return NULL;
    }

    for(;;) {
        if (k & 1) {
            b1 = mult(b, p5);
            Bfree(b);
            b = b1;
            if (b == NULL) {
                Bfree(p5);
                return NULL;
            }
        }
        if (!(k >>= 1))
            break;
        p51 = mult(p5, p5);
        Bfree(p5);
        p5 = p51;
        if (p5 == NULL) {
            Bfree(b);
            return NULL;
        }
    }
    Bfree(p5);
    return b;
}